

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O1

void __thiscall
Fl_Tree_Item::draw_vertical_connector(Fl_Tree_Item *this,int x,int y1,int y2,Fl_Tree_Prefs *prefs)

{
  int yy;
  uint uVar1;
  
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)prefs->_connectorcolor);
  if (prefs->_connectorstyle == FL_TREE_CONNECTOR_DOTTED) {
    for (uVar1 = y1 | 1; (int)uVar1 <= (int)(y2 | 1U); uVar1 = uVar1 + 2) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                (fl_graphics_driver,x,(ulong)uVar1);
    }
  }
  else if (prefs->_connectorstyle == FL_TREE_CONNECTOR_SOLID) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
              (fl_graphics_driver,x,(ulong)(y1 | 1),x,(ulong)(y2 | 1));
    return;
  }
  return;
}

Assistant:

void Fl_Tree_Item::draw_vertical_connector(int x, int y1, int y2, const Fl_Tree_Prefs &prefs) {
  fl_color(prefs.connectorcolor());
  switch ( prefs.connectorstyle() ) {
    case FL_TREE_CONNECTOR_SOLID:
      y1 |= 1;				// force alignment w/dot pattern
      y2 |= 1;				// force alignment w/dot pattern
      fl_line(x,y1,x,y2);
      return;
    case FL_TREE_CONNECTOR_DOTTED:
    {
      y1 |= 1;				// force alignment w/dot pattern
      y2 |= 1;				// force alignment w/dot pattern
      for ( int yy=y1; yy<=y2; yy+=2 ) {
        fl_point(x, yy);
      }
      return;
    }
    case FL_TREE_CONNECTOR_NONE:
      return;
  }
}